

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureAttachmentTest::SubTestContent
          (TextureAttachmentTest *this,GLenum attachment,GLenum texture_target,GLenum internalformat
          ,GLuint level,GLuint levels)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  MessageBuilder *pMVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  GLfloat color [4];
  GLfloat depth;
  GLenum local_1c8;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  if (internalformat != 0x8d48) {
    if ((internalformat != 0x81a6) && (internalformat != 0x88f0)) {
      if (internalformat != 0x8058) {
        return true;
      }
      color[0] = 0.0;
      color[1] = 0.0;
      color[2] = 0.0;
      color[3] = 0.0;
      lVar6 = 0;
      (**(code **)(lVar4 + 0x1220))(0,0,1,1,0x1908,0x1406,color);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glReadPixels has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x26f);
      do {
        if (lVar6 == 0x10) {
          return true;
        }
        fVar8 = *(float *)((long)&s_reference_color + lVar6) - *(float *)((long)color + lVar6);
        fVar7 = -fVar8;
        if (-fVar8 <= fVar8) {
          fVar7 = fVar8;
        }
        lVar6 = lVar6 + 4;
      } while (fVar7 <= 0.0625);
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "Named Framebuffer Texture Layer Attachment test failed with ");
      _depth = glu::getTextureTargetName;
      local_1c8 = texture_target;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&depth,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1," texture set up as ");
      local_1c0.m_getName = glu::getFramebufferAttachmentName;
      local_1c0.m_value = attachment;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1," attachment and texture level ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1," of texture with ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1," levels. The color content of the framebuffer was [");
      std::ostream::operator<<(poVar1,color[0]);
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,color[1]);
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,color[2]);
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,color[3]);
      std::operator<<((ostream *)poVar1,"], but [");
      pMVar5 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,(float *)&s_reference_color);
      std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)&DAT_01714954);
      std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)&DAT_01714958);
      std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)&DAT_0171495c);
      std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      "] was expected.");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00aff220;
    }
    _depth = (code *)((ulong)_depth & 0xffffffff00000000);
    (**(code **)(lVar4 + 0x1220))(0,0,1,1,0x1902,0x1406,&depth,levels);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glReadPixels has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x289);
    fVar8 = 0.5 - depth;
    fVar7 = -fVar8;
    if (-fVar8 <= fVar8) {
      fVar7 = fVar8;
    }
    if (0.0625 < fVar7) {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Named Framebuffer Texture Layer Attachment test failed ");
      std::operator<<((ostream *)poVar1,"with texture set up as ");
      color._0_8_ = glu::getFramebufferAttachmentName;
      color[2] = (GLfloat)attachment;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)color,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1," attachment and texture level ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1," of texture with ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1," levels. The depth content of the framebuffer was [");
      std::ostream::operator<<(poVar1,depth);
      std::operator<<((ostream *)poVar1,"], but [");
      pMVar5 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,(float *)&s_reference_depth);
      std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      "] was expected.");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00aff220;
    }
    if (internalformat != 0x88f0) {
      return true;
    }
  }
  _depth = (code *)((ulong)_depth & 0xffffffff00000000);
  (**(code **)(lVar4 + 0x1220))(0,0,1,1,0x1901,0x1404,&depth);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glReadPixels has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x29e);
  if (depth == 9.80909e-45) {
    return true;
  }
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Named Framebuffer Texture Layer Attachment test failed ");
  std::operator<<((ostream *)poVar1,"with texture set up as ");
  color._0_8_ = glu::getFramebufferAttachmentName;
  color[2] = (GLfloat)attachment;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)color,(ostream *)poVar1);
  std::operator<<((ostream *)poVar1," attachment and texture level ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<((ostream *)poVar1," of texture with ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<((ostream *)poVar1," levels. The stencil content of the framebuffer was [");
  std::ostream::operator<<(poVar1,(int)depth);
  std::operator<<((ostream *)poVar1,"], but [");
  pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&s_reference_stencil);
  std::operator<<(&(pMVar5->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  "] was expected.");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00aff220:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  return false;
}

Assistant:

bool TextureAttachmentTest::SubTestContent(glw::GLenum attachment, glw::GLenum texture_target,
										   glw::GLenum internalformat, glw::GLuint level, glw::GLuint levels)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check framebuffer's color content. */
	if (GL_RGBA8 == internalformat)
	{
		glw::GLfloat color[4] = { 0.f };

		gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_FLOAT, color);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

		for (int i = 0; i < 4 /* color components */; ++i)
		{
			if (de::abs(s_reference_color[i] - color[i]) > 0.0625 /* precision */)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Named Framebuffer Texture Layer Attachment test failed with "
					<< glu::getTextureTargetStr(texture_target) << " texture set up as "
					<< glu::getFramebufferAttachmentStr(attachment) << " attachment and texture level " << level
					<< " of texture with " << levels << " levels. The color content of the framebuffer was ["
					<< color[0] << ", " << color[1] << ", " << color[2] << ", " << color[3] << "], but ["
					<< s_reference_color[0] << ", " << s_reference_color[1] << ", " << s_reference_color[2] << ", "
					<< s_reference_color[3] << "] was expected." << tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	/* Check framebuffer's depth content. */
	if ((GL_DEPTH_COMPONENT24 == internalformat) || (GL_DEPTH24_STENCIL8 == internalformat))
	{
		glw::GLfloat depth = 0.f;

		gl.readPixels(0, 0, 1, 1, GL_DEPTH_COMPONENT, GL_FLOAT, &depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

		if (de::abs(s_reference_depth - depth) > 0.0625 /* precision */)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Named Framebuffer Texture Layer Attachment test failed "
				<< "with texture set up as " << glu::getFramebufferAttachmentStr(attachment)
				<< " attachment and texture level " << level << " of texture with " << levels
				<< " levels. The depth content of the framebuffer was [" << depth << "], but [" << s_reference_depth
				<< "] was expected." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	/* Check framebuffer's stencil content. */
	if ((GL_STENCIL_INDEX8 == internalformat) || (GL_DEPTH24_STENCIL8 == internalformat))
	{
		glw::GLint stencil = 0;

		gl.readPixels(0, 0, 1, 1, GL_STENCIL_INDEX, GL_INT, &stencil);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

		if (s_reference_stencil != stencil)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Named Framebuffer Texture Layer Attachment test failed "
				<< "with texture set up as " << glu::getFramebufferAttachmentStr(attachment)
				<< " attachment and texture level " << level << " of texture with " << levels
				<< " levels. The stencil content of the framebuffer was [" << stencil << "], but ["
				<< s_reference_stencil << "] was expected." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}